

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.cc
# Opt level: O2

int NCONF_load_bio(CONF *conf,BIO *bp,long *eline)

{
  byte bVar1;
  CONF *pCVar2;
  int iVar3;
  uint uVar4;
  BUF_MEM *str;
  undefined4 extraout_var;
  size_t sVar5;
  byte *pbVar6;
  char *pcVar7;
  byte *section_00;
  byte *pbVar8;
  CONF_VALUE *data;
  char *pcVar9;
  CONF_SECTION *pCVar10;
  char *pcVar11;
  size_t sVar12;
  byte *pbVar13;
  byte bVar14;
  uint uVar15;
  ulong uVar16;
  char **pto;
  char **pto_00;
  uint uVar17;
  int iVar18;
  long lVar19;
  byte *pbVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  long local_70;
  char *section;
  CONF_SECTION *local_50;
  CONF *local_48;
  CONF_VALUE *local_40;
  BIO *local_38;
  
  section = (char *)0x0;
  local_38 = bp;
  str = BUF_MEM_new();
  if (str == (BUF_MEM *)0x0) {
    iVar3 = 7;
    iVar18 = 0x17f;
LAB_002089db:
    ERR_put_error(0xd,0,iVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/conf/conf.cc"
                  ,iVar18);
  }
  else {
    section = OPENSSL_strdup("default");
    if (section != (char *)0x0) {
      local_50 = NCONF_new_section((CONF *)conf,section);
      if (local_50 != (CONF_SECTION *)0x0) {
        local_70 = 0;
        local_48 = conf;
LAB_002085d0:
        bVar23 = false;
LAB_002085d5:
        uVar17 = 0;
        bVar24 = bVar23;
LAB_002085da:
        do {
          lVar19 = (long)(int)uVar17;
          iVar3 = BUF_MEM_grow(str,lVar19 + 0x200);
          if (CONCAT44(extraout_var,iVar3) == 0) {
            data = (CONF_VALUE *)0x0;
            iVar3 = 7;
            iVar18 = 0x192;
            goto LAB_00208a41;
          }
          pcVar7 = str->data;
          pcVar11 = pcVar7 + lVar19;
          pcVar7[lVar19] = '\0';
          BIO_gets(local_38,pcVar11,0x1ff);
          pcVar7[lVar19 + 0x1ff] = '\0';
          sVar5 = strlen(pcVar11);
          uVar4 = (uint)sVar5;
          if ((bool)(~bVar24 & uVar4 == 0)) {
            BUF_MEM_free(str);
            OPENSSL_free(section);
            return 1;
          }
          for (uVar16 = sVar5 & 0xffffffff;
              (uVar15 = (int)uVar4 >> 0x1f & uVar4, 0 < (int)(uint)uVar16 &&
              ((pcVar11[uVar16 - 1] == '\r' || (uVar15 = (uint)uVar16, pcVar11[uVar16 - 1] == '\n'))
              )); uVar16 = uVar16 - 1) {
          }
          bVar21 = uVar4 != 0;
          bVar22 = uVar15 == uVar4;
          bVar23 = bVar22 && bVar21;
          if (!bVar22 || !bVar21) {
            pcVar11[(int)uVar15] = '\0';
            local_70 = local_70 + 1;
          }
          bVar24 = SCARRY4(uVar17,uVar15);
          uVar17 = uVar17 + uVar15;
          if (uVar17 != 0 && bVar24 == (int)uVar17 < 0) {
            if ((str->data[(ulong)uVar17 - 1] == '\\') &&
               ((uVar17 == 1 || (str->data[(ulong)uVar17 - 2] != '\\')))) {
              uVar17 = uVar17 - 1;
              bVar24 = true;
              goto LAB_002085da;
            }
          }
          bVar24 = true;
          if (!bVar22 || !bVar21) {
            pbVar13 = (byte *)str->data;
            pbVar6 = pbVar13;
            while ((pcVar11 = (char *)(ulong)*pbVar6, pcVar11 < (char *)0x21 &&
                   ((0x100002600U >> ((ulong)pcVar11 & 0x3f) & 1) != 0))) {
              pbVar6 = pbVar6 + 1;
            }
            do {
              bVar14 = (byte)pcVar11;
              if (bVar14 == 0x22) {
LAB_002086d8:
                do {
                  pbVar20 = pbVar6;
                  bVar1 = pbVar20[1];
                  pbVar6 = pbVar20 + 1;
                  if ((bVar1 == 0) || (bVar1 == bVar14)) {
                    if (bVar1 == bVar14) {
                      pbVar6 = pbVar20 + 2;
                    }
                    break;
                  }
                } while ((bVar1 != 0x5c) || (pbVar6 = pbVar20 + 2, pbVar20[2] != 0));
              }
              else {
                uVar17 = (uint)pcVar11 & 0xff;
                if (uVar17 == 0x27) goto LAB_002086d8;
                if (uVar17 == 0x5c) {
                  pbVar6 = (byte *)scan_esc((char *)pbVar6);
                }
                else {
                  if (uVar17 == 0x60) goto LAB_002086d8;
                  if (((ulong)pcVar11 & 0xff) == 0) goto LAB_00208738;
                  if (uVar17 == 0x23) goto code_r0x00208735;
                  pbVar6 = pbVar6 + 1;
                }
              }
              pcVar11 = (char *)CONCAT71((int7)((ulong)pcVar11 >> 8),*pbVar6);
            } while( true );
          }
        } while( true );
      }
      iVar3 = 0x68;
      iVar18 = 0x18a;
      goto LAB_002089db;
    }
  }
  local_70 = 0;
  data = (CONF_VALUE *)0x0;
LAB_002089e2:
  BUF_MEM_free(str);
  OPENSSL_free(section);
  if (eline != (long *)0x0) {
    *eline = local_70;
  }
  ERR_add_error_dataf("line %ld",local_70);
  value_free(data);
  return 0;
code_r0x00208735:
  *pbVar6 = 0;
LAB_00208738:
  pbVar6 = (byte *)eat_ws((char *)pbVar13);
  uVar17 = (uint)*pbVar6;
  bVar24 = bVar23;
  if (*pbVar6 != 0) goto LAB_0020875e;
  goto LAB_002085da;
LAB_0020875e:
  if (uVar17 != 0x5b) {
    pcVar7 = eat_name((char *)pbVar6);
    if ((*pcVar7 == ':') && (pcVar7[1] == ':')) {
      *pcVar7 = '\0';
      pbVar20 = (byte *)(pcVar7 + 2);
      pcVar7 = eat_name((char *)pbVar20);
      pbVar13 = pbVar6;
      pbVar6 = pbVar20;
    }
    else {
      pbVar13 = (byte *)0x0;
    }
    pbVar20 = (byte *)eat_ws(pcVar7);
    if (*pbVar20 != 0x3d) {
      data = (CONF_VALUE *)0x0;
      iVar3 = 0x66;
      iVar18 = 499;
      goto LAB_00208a41;
    }
    *pcVar7 = '\0';
    section_00 = (byte *)eat_ws((char *)(pbVar20 + 1));
    do {
      pbVar8 = pbVar20;
      pbVar20 = pbVar8 + 1;
    } while (pbVar8[1] != 0);
    while (((pbVar8 != section_00 && (pcVar11 = (char *)(ulong)*pbVar8, pcVar11 < (char *)0x21)) &&
           ((0x100002600U >> ((ulong)pcVar11 & 0x3f) & 1) != 0))) {
      pbVar8 = pbVar8 + -1;
    }
    pbVar8[1] = 0;
    data = CONF_VALUE_new();
    pcVar7 = section;
    if (data == (CONF_VALUE *)0x0) goto LAB_00208a84;
    if (pbVar13 == (byte *)0x0) {
      pbVar13 = (byte *)section;
    }
    pcVar9 = OPENSSL_strdup((char *)pbVar6);
    data->name = pcVar9;
    if ((pcVar9 == (char *)0x0) ||
       (iVar3 = str_copy((CONF *)&data->value,(char *)section_00,pto,pcVar11), iVar3 == 0))
    goto LAB_002089e2;
    iVar3 = strcmp((char *)pbVar13,pcVar7);
    pCVar2 = local_48;
    pCVar10 = local_50;
    if ((iVar3 != 0) &&
       ((pCVar10 = get_section((CONF *)local_48,(char *)pbVar13), pCVar10 == (CONF_SECTION *)0x0 &&
        (pCVar10 = NCONF_new_section((CONF *)pCVar2,(char *)pbVar13), pCVar10 == (CONF_SECTION *)0x0
        )))) {
      iVar3 = 0x68;
      iVar18 = 0x217;
      goto LAB_00208a41;
    }
    pcVar11 = OPENSSL_strdup(pCVar10->name);
    data->section = pcVar11;
    if ((pcVar11 == (char *)0x0) ||
       (sVar12 = OPENSSL_sk_push((OPENSSL_STACK *)pCVar10->values,data), sVar12 == 0))
    goto LAB_002089e2;
    iVar3 = lh_CONF_VALUE_insert((lhash_st_CONF_VALUE *)pCVar2->meth,&local_40,data);
    if (iVar3 == 0) {
      OPENSSL_sk_pop((OPENSSL_STACK *)pCVar10->values);
      goto LAB_002089e2;
    }
    if (local_40 != (CONF_VALUE *)0x0) {
      OPENSSL_sk_delete_ptr((OPENSSL_STACK *)pCVar10->values,local_40);
      value_free(local_40);
    }
    goto LAB_002085d5;
  }
  pbVar13 = (byte *)eat_ws((char *)(pbVar6 + 1));
  pbVar6 = pbVar13;
LAB_00208903:
  pcVar11 = eat_name((char *)pbVar6);
  pbVar20 = (byte *)eat_ws(pcVar11);
  bVar14 = *pbVar20;
  if (bVar14 == 0) goto LAB_00208a94;
  if (bVar14 != 0x5d) goto code_r0x00208926;
  *pcVar11 = '\0';
  iVar3 = str_copy((CONF *)&section,(char *)pbVar13,pto_00,(char *)(ulong)bVar14);
  pCVar2 = local_48;
  pcVar11 = section;
  if (iVar3 == 0) {
LAB_00208a84:
    data = (CONF_VALUE *)0x0;
    goto LAB_002089e2;
  }
  local_50 = get_section((CONF *)local_48,section);
  if ((local_50 != (CONF_SECTION *)0x0) ||
     (local_50 = NCONF_new_section((CONF *)pCVar2,pcVar11), local_50 != (CONF_SECTION *)0x0))
  goto LAB_002085d0;
  data = (CONF_VALUE *)0x0;
  iVar3 = 0x68;
  iVar18 = 0x1e2;
LAB_00208a41:
  ERR_put_error(0xd,0,iVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/conf/conf.cc"
                ,iVar18);
  goto LAB_002089e2;
code_r0x00208926:
  bVar23 = pbVar6 == pbVar20;
  pbVar6 = pbVar20;
  if (bVar23) {
LAB_00208a94:
    data = (CONF_VALUE *)0x0;
    iVar3 = 0x65;
    iVar18 = 0x1d7;
    goto LAB_00208a41;
  }
  goto LAB_00208903;
}

Assistant:

int NCONF_load_bio(CONF *conf, BIO *in, long *out_error_line) {
  static const size_t CONFBUFSIZE = 512;
  int bufnum = 0, i, ii;
  BUF_MEM *buff = NULL;
  char *s, *p, *end;
  int again;
  long eline = 0;
  CONF_VALUE *v = NULL;
  CONF_SECTION *sv = NULL;
  char *section = NULL, *buf;
  char *start, *psection, *pname;

  if ((buff = BUF_MEM_new()) == NULL) {
    OPENSSL_PUT_ERROR(CONF, ERR_R_BUF_LIB);
    goto err;
  }

  section = OPENSSL_strdup(kDefaultSectionName);
  if (section == NULL) {
    goto err;
  }

  sv = NCONF_new_section(conf, section);
  if (sv == NULL) {
    OPENSSL_PUT_ERROR(CONF, CONF_R_UNABLE_TO_CREATE_NEW_SECTION);
    goto err;
  }

  bufnum = 0;
  again = 0;
  for (;;) {
    if (!BUF_MEM_grow(buff, bufnum + CONFBUFSIZE)) {
      OPENSSL_PUT_ERROR(CONF, ERR_R_BUF_LIB);
      goto err;
    }
    p = &(buff->data[bufnum]);
    *p = '\0';
    BIO_gets(in, p, CONFBUFSIZE - 1);
    p[CONFBUFSIZE - 1] = '\0';
    ii = i = strlen(p);
    if (i == 0 && !again) {
      break;
    }
    again = 0;
    while (i > 0) {
      if ((p[i - 1] != '\r') && (p[i - 1] != '\n')) {
        break;
      } else {
        i--;
      }
    }
    // we removed some trailing stuff so there is a new
    // line on the end.
    if (ii && i == ii) {
      again = 1;  // long line
    } else {
      p[i] = '\0';
      eline++;  // another input line
    }

    // we now have a line with trailing \r\n removed

    // i is the number of bytes
    bufnum += i;

    v = NULL;
    // check for line continuation
    if (bufnum >= 1) {
      // If we have bytes and the last char '\\' and
      // second last char is not '\\'
      p = &(buff->data[bufnum - 1]);
      if (is_esc(p[0]) && ((bufnum <= 1) || !is_esc(p[-1]))) {
        bufnum--;
        again = 1;
      }
    }
    if (again) {
      continue;
    }
    bufnum = 0;
    buf = buff->data;

    clear_comments(buf);
    s = eat_ws(buf);
    if (*s == '\0') {
      continue;  // blank line
    }
    if (*s == '[') {
      char *ss;

      s++;
      start = eat_ws(s);
      ss = start;
    again:
      end = eat_name(ss);
      p = eat_ws(end);
      if (*p != ']') {
        if (*p != '\0' && ss != p) {
          ss = p;
          goto again;
        }
        OPENSSL_PUT_ERROR(CONF, CONF_R_MISSING_CLOSE_SQUARE_BRACKET);
        goto err;
      }
      *end = '\0';
      if (!str_copy(conf, NULL, &section, start)) {
        goto err;
      }
      if ((sv = get_section(conf, section)) == NULL) {
        sv = NCONF_new_section(conf, section);
      }
      if (sv == NULL) {
        OPENSSL_PUT_ERROR(CONF, CONF_R_UNABLE_TO_CREATE_NEW_SECTION);
        goto err;
      }
      continue;
    } else {
      pname = s;
      psection = NULL;
      end = eat_name(s);
      if ((end[0] == ':') && (end[1] == ':')) {
        *end = '\0';
        end += 2;
        psection = pname;
        pname = end;
        end = eat_name(end);
      }
      p = eat_ws(end);
      if (*p != '=') {
        OPENSSL_PUT_ERROR(CONF, CONF_R_MISSING_EQUAL_SIGN);
        goto err;
      }
      *end = '\0';
      p++;
      start = eat_ws(p);
      while (*p != '\0') {
        p++;
      }
      p--;
      while (p != start && is_conf_ws(*p)) {
        p--;
      }
      p++;
      *p = '\0';

      if (!(v = CONF_VALUE_new())) {
        goto err;
      }
      if (psection == NULL) {
        psection = section;
      }
      v->name = OPENSSL_strdup(pname);
      if (v->name == NULL) {
        goto err;
      }
      if (!str_copy(conf, psection, &(v->value), start)) {
        goto err;
      }

      CONF_SECTION *tv;
      if (strcmp(psection, section) != 0) {
        if ((tv = get_section(conf, psection)) == NULL) {
          tv = NCONF_new_section(conf, psection);
        }
        if (tv == NULL) {
          OPENSSL_PUT_ERROR(CONF, CONF_R_UNABLE_TO_CREATE_NEW_SECTION);
          goto err;
        }
      } else {
        tv = sv;
      }
      if (add_string(conf, tv, v) == 0) {
        goto err;
      }
      v = NULL;
    }
  }
  BUF_MEM_free(buff);
  OPENSSL_free(section);
  return 1;

err:
  BUF_MEM_free(buff);
  OPENSSL_free(section);
  if (out_error_line != NULL) {
    *out_error_line = eline;
  }
  ERR_add_error_dataf("line %ld", eline);
  value_free(v);
  return 0;
}